

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void ImportSimpleModuleType(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx,uint i)

{
  ModuleData *pMVar1;
  ByteCode *code;
  IntrusiveList<TypeHandle> arguments_00;
  int iVar2;
  char *symbols;
  ExternTypeInfo *pEVar3;
  ExternMemberInfo *pEVar4;
  undefined4 extraout_var;
  size_t sVar5;
  TypeGenericAlias *pTVar6;
  TypeBase *pTVar7;
  TypeBase *pTVar8;
  undefined4 extraout_var_00;
  TypeUnsizedArray *pTVar9;
  TypeFunction *pTVar10;
  TypeBase **ppTVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  ExternTypeInfo *type;
  InplaceStr name;
  IntrusiveList<TypeHandle> arguments;
  TypeHandle *node;
  
  pMVar1 = moduleCtx->data;
  code = pMVar1->bytecode;
  symbols = FindSymbols(code);
  pEVar3 = FindFirstType(code);
  pEVar4 = FindFirstMember(code);
  if (CAT_FUNCTION < pEVar3[i].subCat) {
    __assert_fail("!\"unexpected type category\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x3069,
                  "void ImportSimpleModuleType(ExpressionContext &, SynBase *, ModuleContext &, unsigned int)"
                 );
  }
  type = pEVar3 + i;
  switch(pEVar3[i].subCat) {
  case CAT_NONE:
    uVar13 = type->offsetToName;
    iVar2 = strcmp(symbols + uVar13,"generic");
    if (iVar2 != 0) {
      if (symbols[uVar13] != '@') {
        pTVar7 = CheckPreviousTypeDefinition(ctx,source,moduleCtx,symbols,type,(TypeClass **)0x0);
        if (pTVar7 != (TypeBase *)0x0) {
          ppTVar11 = SmallArray<TypeBase_*,_32U>::operator[](&moduleCtx->types,i);
          *ppTVar11 = pTVar7;
          return;
        }
        pcVar12 = (moduleCtx->data->name).begin;
        anon_unknown.dwarf_ff84f::Stop
                  (ctx,source,"ERROR: new type in module %.*s named %s unsupported",
                   (ulong)(uint)(*(int *)&(moduleCtx->data->name).end - (int)pcVar12),pcVar12,
                   symbols + type->offsetToName);
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      uVar13 = type->offsetToName;
      sVar5 = strlen(symbols + (ulong)uVar13 + 1);
      name.end = symbols + sVar5 + uVar13 + 1;
      name.begin = symbols + (ulong)uVar13 + 1;
      SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar2),name);
      pTVar6 = ExpressionContext::GetGenericAliasType
                         (ctx,(SynIdentifier *)CONCAT44(extraout_var,iVar2));
      ppTVar11 = SmallArray<TypeBase_*,_32U>::operator[](&moduleCtx->types,i);
      *ppTVar11 = &pTVar6->super_TypeBase;
      goto LAB_001e0be1;
    }
    pTVar10 = (TypeFunction *)ctx->typeGeneric;
    break;
  case CAT_ARRAY:
    pTVar7 = GetImportedModuleTypeAt(ctx,source,moduleCtx,(type->field_11).subType);
    if (pTVar7 != (TypeBase *)0x0) {
      if ((ulong)(type->field_8).arrSize == 0xffffffff) {
        pTVar9 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar7);
      }
      else {
        pTVar9 = (TypeUnsizedArray *)
                 ExpressionContext::GetArrayType(ctx,pTVar7,(ulong)(type->field_8).arrSize);
      }
      ppTVar11 = SmallArray<TypeBase_*,_32U>::operator[](&moduleCtx->types,i);
      *ppTVar11 = (TypeBase *)pTVar9;
      ppTVar11 = SmallArray<TypeBase_*,_32U>::operator[](&moduleCtx->types,i);
      (*ppTVar11)->importModule = pMVar1;
      return;
    }
LAB_001e0cac:
    uVar13 = type->offsetToName;
    uVar14 = *(int *)&(moduleCtx->data->name).end - (int)(moduleCtx->data->name).begin;
    pcVar12 = "ERROR: can\'t find sub type for \'%s\' in module %.*s";
LAB_001e0d19:
    anon_unknown.dwarf_ff84f::Stop(ctx,source,pcVar12,symbols + uVar13,(ulong)uVar14);
  case CAT_POINTER:
    pTVar7 = GetImportedModuleTypeAt(ctx,source,moduleCtx,(type->field_11).subType);
    if (pTVar7 == (TypeBase *)0x0) goto LAB_001e0cac;
    pTVar10 = (TypeFunction *)ExpressionContext::GetReferenceType(ctx,pTVar7);
    break;
  case CAT_FUNCTION:
    pTVar7 = GetImportedModuleTypeAt(ctx,source,moduleCtx,pEVar4[(type->field_11).subType].type);
    if (pTVar7 == (TypeBase *)0x0) {
      uVar13 = type->offsetToName;
      uVar14 = *(int *)&(moduleCtx->data->name).end - (int)(moduleCtx->data->name).begin;
      pcVar12 = "ERROR: can\'t find return type for \'%s\' in module %.*s";
      goto LAB_001e0d19;
    }
    arguments.head = (TypeHandle *)0x0;
    arguments.tail = (TypeHandle *)0x0;
    for (uVar13 = 1; uVar13 - 1 < (type->field_8).arrSize; uVar13 = uVar13 + 1) {
      pTVar8 = GetImportedModuleTypeAt
                         (ctx,source,moduleCtx,pEVar4[(type->field_11).subType + uVar13].type);
      if (pTVar8 == (TypeBase *)0x0) {
        pcVar12 = (moduleCtx->data->name).begin;
        anon_unknown.dwarf_ff84f::Stop
                  (ctx,source,"ERROR: can\'t find argument %d type for \'%s\' in module %.*s",
                   (ulong)uVar13,symbols + type->offsetToName,
                   (ulong)(uint)(*(int *)&(moduleCtx->data->name).end - (int)pcVar12),pcVar12);
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      node = (TypeHandle *)CONCAT44(extraout_var_00,iVar2);
      node->type = pTVar8;
      node->next = (TypeHandle *)0x0;
      node->listed = false;
      IntrusiveList<TypeHandle>::push_back(&arguments,node);
    }
    arguments_00.tail = arguments.tail;
    arguments_00.head = arguments.head;
    pTVar10 = ExpressionContext::GetFunctionType(ctx,source,pTVar7,arguments_00);
  }
  ppTVar11 = SmallArray<TypeBase_*,_32U>::operator[](&moduleCtx->types,i);
  *ppTVar11 = &pTVar10->super_TypeBase;
LAB_001e0be1:
  ppTVar11 = SmallArray<TypeBase_*,_32U>::operator[](&moduleCtx->types,i);
  (*ppTVar11)->importModule = pMVar1;
  return;
}

Assistant:

void ImportSimpleModuleType(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx, unsigned i)
{
	ModuleData *importModule = moduleCtx.data;

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	ExternTypeInfo *typeList = FindFirstType(bCode);
	ExternMemberInfo *memberList = FindFirstMember(bCode);

	ExternTypeInfo &type = typeList[i];

	switch(type.subCat)
	{
	case ExternTypeInfo::CAT_NONE:
		if(strcmp(symbols + type.offsetToName, "generic") == 0)
		{
			// TODO: explicit category
			moduleCtx.types[i] = ctx.typeGeneric;

			moduleCtx.types[i]->importModule = importModule;
		}
		else if(*(symbols + type.offsetToName) == '@')
		{
			// TODO: explicit category
			moduleCtx.types[i] = ctx.GetGenericAliasType(new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr(symbols + type.offsetToName + 1)));

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			if(TypeBase *prevType = CheckPreviousTypeDefinition(ctx, source, moduleCtx, symbols, type, NULL))
			{
				moduleCtx.types[i] = prevType;
			}
			else
			{
				Stop(ctx, source, "ERROR: new type in module %.*s named %s unsupported", FMT_ISTR(moduleCtx.data->name), symbols + type.offsetToName);
			}
		}
		break;
	case ExternTypeInfo::CAT_ARRAY:
		if(TypeBase *subType = GetImportedModuleTypeAt(ctx, source, moduleCtx, type.subType))
		{

			if(type.arrSize == ~0u)
				moduleCtx.types[i] = ctx.GetUnsizedArrayType(subType);
			else
				moduleCtx.types[i] = ctx.GetArrayType(subType, type.arrSize);

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			Stop(ctx, source, "ERROR: can't find sub type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}
		break;
	case ExternTypeInfo::CAT_POINTER:
		if(TypeBase *subType = GetImportedModuleTypeAt(ctx, source, moduleCtx, type.subType))
		{
			moduleCtx.types[i] = ctx.GetReferenceType(subType);

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			Stop(ctx, source, "ERROR: can't find sub type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}
		break;
	case ExternTypeInfo::CAT_FUNCTION:
		if(TypeBase *returnType = GetImportedModuleTypeAt(ctx, source, moduleCtx, memberList[type.memberOffset].type))
		{
			IntrusiveList<TypeHandle> arguments;

			for(unsigned n = 0; n < type.memberCount; n++)
			{
				TypeBase *argType = GetImportedModuleTypeAt(ctx, source, moduleCtx, memberList[type.memberOffset + n + 1].type);

				if(!argType)
					Stop(ctx, source, "ERROR: can't find argument %d type for '%s' in module %.*s", n + 1, symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

				arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argType));
			}

			moduleCtx.types[i] = ctx.GetFunctionType(source, returnType, arguments);

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			Stop(ctx, source, "ERROR: can't find return type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}
		break;
	default:
		assert(!"unexpected type category");
	}
}